

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O2

_DecodeResult
decode_internal(_CodeInfo *_ci,int supportOldIntr,_DInst *result,uint maxResultCount,
               uint *usedInstructionsCount)

{
  byte *pbVar1;
  ushort uVar2;
  long lVar3;
  _OffsetType _Var4;
  uint8_t *puVar5;
  int iVar6;
  ushort uVar7;
  uint16_t uVar8;
  uint uVar9;
  int iVar10;
  _InstInfo *ii;
  short *psVar11;
  char cVar12;
  byte bVar13;
  uint uVar14;
  _iflags _Var15;
  uint uVar16;
  _DecodeType _Var17;
  _InstSharedInfo *p_Var18;
  uint modrm;
  _DecodeType effAdrSz;
  _DInst *di;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  _DecodeResult _Var25;
  int local_120;
  uint local_11c;
  _CodeInfo local_118;
  ulong local_e0;
  _PrefixState ps;
  short sVar19;
  short sVar22;
  
  local_118.codeOffset = _ci->codeOffset;
  local_118.nextOffset = _ci->nextOffset;
  local_118.code = _ci->code;
  local_118.codeLen = _ci->codeLen;
  local_118.dt = _ci->dt;
  local_118._40_8_ = *(undefined8 *)&_ci->features;
  lVar3 = (ulong)maxResultCount << 6;
  if (supportOldIntr != 0) {
    lVar3 = (ulong)maxResultCount * 0xa8;
  }
  local_e0 = 0xa8;
  if (supportOldIntr == 0) {
    local_e0 = 0x40;
  }
  local_118.addrMask = 0xffffffffffffffff;
  ps.count = 1;
  auVar24._0_4_ = -(uint)((local_118._40_8_ & 0x7f8) == 0);
  auVar24._4_4_ = -(uint)((local_118._40_8_ & 0x800) == 0);
  auVar24._8_4_ = -(uint)((local_118._40_8_ & 0x1000) == 0);
  auVar24._12_4_ = -(uint)((local_118._40_8_ & 0x2000) == 0);
  uVar9 = movmskps((int)&ps,auVar24);
  auVar23._0_4_ = -(uint)((local_118._40_8_ & 8) != 0);
  auVar23._4_4_ = -(uint)((local_118._40_8_ & 0x10) != 0);
  auVar23._8_4_ = -(uint)((local_118._40_8_ & 0x20) != 0);
  auVar23._12_4_ = -(uint)((local_118._40_8_ & 0x40) != 0);
  auVar20._0_4_ = -(uint)((local_118._40_8_ & 0x80) != 0);
  auVar20._4_4_ = -(uint)((local_118._40_8_ & 0x100) != 0);
  auVar20._8_4_ = -(uint)((local_118._40_8_ & 0x200) != 0);
  auVar20._12_4_ = -(uint)((local_118._40_8_ & 0x400) != 0);
  auVar24 = packssdw(auVar23,auVar20);
  local_11c = local_118.features;
  di = result;
LAB_00103734:
  do {
    do {
      puVar5 = local_118.code;
      _Var4 = local_118.codeOffset;
      iVar6 = local_118.codeLen;
      if (local_118.codeLen < 1) goto LAB_00103fca;
      if (ps.count != 0) {
        ps.vexV = 0;
        ps.vrex = 0;
        ps.vexPos = (uint8_t *)0x0;
        ps.pfxIndexer[1] = 0;
        ps.pfxIndexer[2] = 0;
        ps.pfxIndexer[3] = 0;
        ps.pfxIndexer[4] = 0;
        ps.prefixExtType = PET_NONE;
        ps.isOpSizeMandatory = 0;
        ps.decodedPrefixes = 0;
        ps.usedPrefixes = 0;
        ps.count = 0;
        ps.unusedPrefixesMask = 0;
        ps.pfxIndexer[0] = 0;
      }
      if ((_DInst *)((long)result->ops + lVar3 + -0x22) <= di) {
        _Var25 = DECRES_MEMORYERR;
        goto LAB_00103fcc;
      }
      local_120 = 0;
      ii = inst_lookup(&local_118,&ps,&local_120);
      auVar20 = (undefined1  [16])ps._0_16_;
      if (ii == (_InstInfo *)0x0) goto LAB_00103d40;
      uVar7 = ii->sharedIndex;
      uVar16 = FlagsTable[InstSharedInfoTable[uVar7].flagsIndex];
      _Var17 = local_118.dt;
      if (local_120 == 0) {
        effAdrSz = local_118.dt;
        if (local_118.dt == Decode64Bits) {
          _Var17 = ((uVar16 & 0x3000000) == 0x1000000) + Decode32Bits;
          effAdrSz = Decode64Bits;
        }
      }
      else {
        _Var15 = ps.decodedPrefixes;
        if (((((ps.decodedPrefixes >> 0xd & 1) != 0) && (ps.prefixExtType == PET_REX)) &&
            (((undefined1  [16])ps._32_16_ & (undefined1  [16])0x800000000) != (undefined1  [16])0x0
            )) && (ps.isOpSizeMandatory == 0)) {
          _Var15 = ps.decodedPrefixes & 0xffffdfff;
          ps.decodedPrefixes = _Var15;
          auVar23 = (undefined1  [16])ps._0_16_;
          ps.unusedPrefixesMask = auVar20._12_2_;
          ps.pfxIndexer[0] = auVar20._14_2_;
          ps._0_12_ = auVar23._0_12_;
          ps.unusedPrefixesMask = ps.unusedPrefixesMask | ps.pfxIndexer[3];
        }
        effAdrSz = (uint)(local_118.dt != Decode32Bits);
        if ((_Var15 >> 0xe & 1) == 0) {
          effAdrSz = local_118.dt;
        }
        if ((_Var15 >> 0xd & 1) == 0) {
          if (local_118.dt == Decode64Bits) {
            if ((uVar16 & 0x3000000) == 0x1000000) {
              _Var17 = Decode64Bits;
            }
            else {
              _Var17 = Decode64Bits -
                       (((undefined1  [16])ps._32_16_ & (undefined1  [16])0x800000000) ==
                        (undefined1  [16])0x0 || (_Var15 >> 0x19 & 1) == 0);
            }
          }
        }
        else {
          _Var17 = (_DecodeType)(local_118.dt == Decode16Bits);
        }
      }
      *(undefined1 (*) [16])&di->ops[3].size = (undefined1  [16])0x0;
      di->opcode = 0;
      di->ops[0].type = '\0';
      di->ops[0].index = '\0';
      di->ops[0].size = 0;
      di->ops[1].type = '\0';
      di->ops[1].index = '\0';
      di->ops[1].size = 0;
      di->ops[2].type = '\0';
      di->ops[2].index = '\0';
      di->ops[2].size = 0;
      di->ops[3].type = '\0';
      di->ops[3].index = '\0';
      di->addr = 0;
      di->flags = 0;
      di->unusedPrefixesMask = 0;
      di->usedRegistersMask = 0;
      di->imm = (_Value)0x0;
      di->disp = 0;
      if ((uVar16 & 1) == 0) {
        modrm = 0;
      }
      else {
        if ((uVar16 >> 0x1e & 1) == 0) {
          local_118.code = local_118.code + 1;
          iVar10 = local_118.codeLen;
          local_118.codeLen = local_118.codeLen + -1;
          if (iVar10 < 1) goto LAB_00103d40;
        }
        modrm = (uint)*local_118.code;
      }
      local_118.code = local_118.code + 1;
      p_Var18 = InstSharedInfoTable + uVar7;
      di->addr = local_118.addrMask & local_118.codeOffset;
      di->opcode = ii->opcodeId;
      uVar2 = InstSharedInfoTable[uVar7].meta;
      di->segment = 0xff;
      di->base = 0xff;
      di->flags = (ushort)((effAdrSz & (Decode64Bits|Decode32Bits)) << 10) | uVar2 & 0x8000;
      if (InstSharedInfoTable[uVar7].d != 0) {
        if ((((uVar16 & 0x10100000) != 0) &&
            (((modrm < 0xc0 && ((uVar16 & 0x100000) != 0)) ||
             (((uVar16 >> 0x1c & 1) != 0 && ((modrm & 0x38) != 0)))))) ||
           (iVar10 = operands_extract(&local_118,di,ii,uVar16,(uint)InstSharedInfoTable[uVar7].d,
                                      modrm,&ps,_Var17,effAdrSz,di->ops), iVar10 == 0))
        goto LAB_00103d40;
        if (InstSharedInfoTable[uVar7].s == 0) {
          cVar12 = '\x01';
        }
        else {
          iVar10 = operands_extract(&local_118,di,ii,uVar16,(uint)InstSharedInfoTable[uVar7].s,modrm
                                    ,&ps,_Var17,effAdrSz,di->ops + 1);
          if (iVar10 == 0) goto LAB_00103d40;
          cVar12 = '\x02';
          if ((uVar16 >> 0x11 & 1) != 0) {
            iVar10 = operands_extract(&local_118,di,ii,uVar16,
                                      (uint)*(byte *)((long)&ii[1].sharedIndex + 1),modrm,&ps,_Var17
                                      ,effAdrSz,di->ops + 2);
            if (iVar10 == 0) goto LAB_00103d40;
            cVar12 = '\x03';
            if ((uVar16 >> 0x12 & 1) != 0) {
              iVar10 = operands_extract(&local_118,di,ii,uVar16,(uint)(byte)ii[1].opcodeId,modrm,&ps
                                        ,_Var17,effAdrSz,di->ops + 3);
              cVar12 = '\x04';
              if (iVar10 == 0) goto LAB_00103d40;
            }
          }
        }
        di->flags = di->flags | (ushort)(uVar16 >> 0x19) & 0xffc0;
        di->opsNo = di->opsNo + cVar12;
      }
      if ((uVar16 & 0x8e0c060) == 0) {
LAB_00103bc4:
        if (_Var17 == Decode64Bits) {
          pbVar1 = (byte *)((long)&di->flags + 1);
          *pbVar1 = *pbVar1 | 2;
          if ((uVar16 & 0x4010000) != 0) {
            if ((0xbf < modrm) && ((uVar16 & 0x80000) != 0)) goto LAB_00103d40;
            if (((uVar16 >> 0x1a & 1) == 0) ||
               (((undefined1  [16])ps._32_16_ & (undefined1  [16])0x800000000) ==
                (undefined1  [16])0x0)) {
LAB_00103ce4:
              uVar8 = ii[2].sharedIndex;
            }
            else {
              ps._0_8_ = ps._0_8_ | 0x200000000000000;
LAB_00103ceb:
              uVar8 = ii[2].opcodeId;
            }
LAB_00103cf0:
            di->opcode = uVar8;
          }
        }
        else if (_Var17 == Decode32Bits) {
          pbVar1 = (byte *)((long)&di->flags + 1);
          *pbVar1 = *pbVar1 | 1;
          if ((uVar16 >> 0x10 & 1) != 0) {
            if (((uVar16 >> 0x13 & 1) == 0) || (modrm < 0xc0)) {
              di->opcode = ii[2].sharedIndex;
            }
LAB_00103c50:
            ps._0_6_ = ps._0_6_ | 0x200000000000;
          }
        }
        else if ((uVar16 & 0x1010008) == 0x10000) goto LAB_00103c50;
LAB_00103cf5:
        if (((local_120 != 0) && ((uVar16 & 0x20000000) != 0)) &&
           ((((ii[1].sharedIndex & 4) != 0 &&
             (((undefined1  [16])ps._32_16_ & (undefined1  [16])0x800000000) !=
              (undefined1  [16])0x0)) ||
            (((ii[1].sharedIndex & 8) != 0 &&
             (((undefined1  [16])ps._32_16_ & (undefined1  [16])0x1000000000) !=
              (undefined1  [16])0x0)))))) {
          di->opcode = ii[2].sharedIndex;
        }
        bVar13 = (char)local_118.code - (char)puVar5;
        di->size = bVar13;
        if ((bVar13 & 0xf0) != 0) goto LAB_00103d40;
        if (local_120 != 0) {
          uVar8 = prefixes_set_unused_mask(&ps);
          di->unusedPrefixesMask = uVar8;
        }
        uVar7 = p_Var18->meta;
        di->meta = uVar7;
        uVar16 = (uint)uVar7;
        if ((local_118._40_8_ & 0x4000) != 0) {
          bVar13 = p_Var18->testedFlagsMask;
          if (bVar13 != 0) {
            di->testedFlagsMask =
                 (ushort)((bVar13 & 0x20) << 6) |
                 (ushort)((bVar13 & 8) << 7) | CONCAT11(bVar13,bVar13) & 0x2d5;
          }
          bVar13 = p_Var18->modifiedFlagsMask;
          if (bVar13 != 0) {
            di->modifiedFlagsMask =
                 (ushort)((bVar13 & 0x20) << 6) |
                 (ushort)((bVar13 & 8) << 7) | CONCAT11(bVar13,bVar13) & 0x2d5;
          }
          bVar13 = p_Var18->undefinedFlagsMask;
          uVar16 = (uint)uVar7;
          if (bVar13 != 0) {
            di->undefinedFlagsMask =
                 (ushort)((bVar13 & 0x20) << 6) |
                 (ushort)((bVar13 & 8) << 7) | CONCAT11(bVar13,bVar13) & 0x2d5;
          }
        }
      }
      else {
        if ((short)uVar16 < 0) {
          ps.usedPrefixes = ps.usedPrefixes | ps.decodedPrefixes & 0x2000;
        }
        if (local_118.dt == Decode64Bits) {
          uVar14 = uVar16 >> 0x17;
        }
        else {
          uVar14 = uVar16 >> 0x1b;
        }
        if ((uVar14 & 1) != 0) goto LAB_00103d40;
        if ((uVar16 >> 0x15 & 1) != 0) {
          ii = inst_lookup_3dnow(&local_118);
          if (ii == (_InstInfo *)0x0) goto LAB_00103d40;
          p_Var18 = InstSharedInfoTable + ii->sharedIndex;
          uVar16 = FlagsTable[p_Var18->flagsIndex];
          di->opcode = ii->opcodeId;
        }
        if ((uVar16 >> 0x16 & 1) == 0) {
          if (((uVar16 & 0x60) != 0) && (local_120 != 0)) {
            if ((uVar16 & 0x20) == 0) {
LAB_00103b9e:
              if ((uVar16 & 0x40) != 0) {
                uVar7 = 4;
                uVar14 = 0x40;
                if (((undefined1  [16])ps._0_16_ & (undefined1  [16])0x40) != (undefined1  [16])0x0)
                goto LAB_00103bb1;
              }
            }
            else {
              uVar7 = 2;
              uVar14 = 0x20;
              if (((undefined1  [16])ps._0_16_ & (undefined1  [16])0x20) == (undefined1  [16])0x0)
              goto LAB_00103b9e;
LAB_00103bb1:
              ps.usedPrefixes = ps.usedPrefixes | uVar14;
              di->flags = di->flags | uVar7;
            }
          }
          if ((uVar16 >> 0xe & 1) == 0) goto LAB_00103bc4;
          if ((uVar16 >> 0x10 & 1) != 0) {
            ps._0_6_ = ps._0_6_ | 0x400000000000;
            if (effAdrSz == Decode32Bits) goto LAB_00103ce4;
            if (effAdrSz == Decode16Bits) {
              uVar8 = ii->opcodeId;
              goto LAB_00103cf0;
            }
            goto LAB_00103ceb;
          }
          if ((short)uVar16 < 0) {
            di->opcode = ii->opcodeId;
            ps._0_6_ = ps._0_6_ | 0x400000000000;
          }
          goto LAB_00103cf5;
        }
        iVar10 = local_118.codeLen;
        local_118.codeLen = local_118.codeLen + -1;
        if (0 < iVar10) {
          bVar13 = *local_118.code;
          local_118.code = local_118.code + 1;
          if ((uVar16 >> 0x1d & 1) == 0) {
            if (bVar13 < 8) {
              psVar11 = (short *)((long)CmpMnemonicOffsets + (ulong)((uint)bVar13 * 2));
LAB_00103cc3:
              uVar8 = *psVar11 + ii->opcodeId;
              goto LAB_00103cf0;
            }
          }
          else if (bVar13 < 0x20) {
            psVar11 = (short *)((long)VCmpMnemonicOffsets + (ulong)((uint)bVar13 * 2));
            goto LAB_00103cc3;
          }
        }
LAB_00103d40:
        if (*puVar5 != 0x9b) {
          local_118.codeOffset = local_118.codeOffset + di->size;
          if ((local_11c & 4) == 0) {
            di->addr = 0;
            di->flags = 0;
            di->unusedPrefixesMask = 0;
            di->usedRegistersMask = 0;
            *(undefined1 (*) [16])&di->ops[3].size = (undefined1  [16])0x0;
            di->opcode = 0;
            di->ops[0].type = '\0';
            di->ops[0].index = '\0';
            di->ops[0].size = 0;
            di->ops[1].type = '\0';
            di->ops[1].index = '\0';
            di->ops[1].size = 0;
            di->ops[2].type = '\0';
            di->ops[2].index = '\0';
            di->ops[2].size = 0;
            di->ops[3].type = '\0';
            di->ops[3].index = '\0';
            di->imm = (_Value)0x0;
            di->disp = 0;
            di->flags = 0xffff;
            (di->imm).byte = *puVar5;
            di->size = '\x01';
            di->addr = local_118.addrMask & _Var4;
            di = (_DInst *)((long)di->ops + (local_e0 - 0x22));
            if ((uVar9 & 4) == 0) goto LAB_00103fca;
          }
          local_118.code = puVar5 + 1;
          local_118.codeLen = iVar6 + -1;
          local_118.codeOffset = _Var4 + 1;
          goto LAB_00103734;
        }
        *(undefined1 (*) [16])&di->ops[3].size = (undefined1  [16])0x0;
        di->opcode = 0;
        di->ops[0].type = '\0';
        di->ops[0].index = '\0';
        di->ops[0].size = 0;
        di->ops[1].type = '\0';
        di->ops[1].index = '\0';
        di->ops[1].size = 0;
        di->ops[2].type = '\0';
        di->ops[2].index = '\0';
        di->ops[2].size = 0;
        di->ops[3].type = '\0';
        di->ops[3].index = '\0';
        di->addr = 0;
        di->flags = 0;
        di->unusedPrefixesMask = 0;
        di->usedRegistersMask = 0;
        di->imm = (_Value)0x0;
        di->disp = 0;
        di->addr = local_118.addrMask & local_118.codeOffset;
        (di->imm).sbyte = -0x65;
        di->base = 0xff;
        di->size = '\x01';
        di->segment = 0xff;
        di->opcode = 0x273a;
        di->meta = 0x100;
        local_118.codeLen = ((int)local_118.code - (int)puVar5) + local_118.codeLen + -1;
        local_118.code = puVar5 + 1;
        uVar16 = (uint)CONCAT62((int6)((ulong)local_118.code >> 0x10),0x100);
      }
      local_118.codeOffset = local_118.codeOffset + di->size;
      if ((local_11c & 0x2ffc) == 0) goto LAB_00103f4d;
      if ((byte)((byte)uVar9 >> 3) == 0) {
        local_118.code = puVar5 + 1;
        local_118.codeLen = iVar6 + -1;
        local_118.codeOffset = _Var4 + 1;
      }
    } while (((local_11c & 4) != 0) && ((uVar16 & 0xf) == 0));
    if (((uVar9 & 2) == 0) && ((short)di->flags < 0)) goto LAB_00103fc5;
    if (((uVar9 & 1) == 0) && ((uVar16 & 0xf) != 0)) {
      auVar20 = pshuflw(ZEXT416(uVar16 & 0xffff000f),ZEXT416(uVar16 & 0xffff000f),0);
      sVar19 = auVar20._0_2_;
      auVar21._0_2_ = -(ushort)(sVar19 == 1);
      sVar22 = auVar20._2_2_;
      auVar21._2_2_ = -(ushort)(sVar22 == 2);
      auVar21._4_2_ = -(ushort)(sVar19 == 3);
      auVar21._6_2_ = -(ushort)(sVar22 == 4);
      auVar21._8_2_ = -(ushort)(sVar19 == 5);
      auVar21._10_2_ = -(ushort)(sVar22 == 6);
      auVar21._12_2_ = -(ushort)(sVar19 == 7);
      auVar21._14_2_ = -(ushort)(sVar22 == 8);
      auVar20 = psllw(auVar21 & auVar24,0xf);
      if ((((((((auVar20 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar20 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar20 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar20 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar20[0xf] < '\0'
         ) {
LAB_00103fc5:
        di = (_DInst *)((long)di->ops + (local_e0 - 0x22));
LAB_00103fca:
        _Var25 = DECRES_SUCCESS;
LAB_00103fcc:
        *usedInstructionsCount = (uint)((ulong)((long)di - (long)result) / local_e0);
        _ci->nextOffset = local_118.codeOffset;
        return _Var25;
      }
    }
LAB_00103f4d:
    di = (_DInst *)((long)di->ops + (local_e0 - 0x22));
  } while( true );
}

Assistant:

_DecodeResult decode_internal(_CodeInfo* _ci, int supportOldIntr, _DInst result[], unsigned int maxResultCount, unsigned int* usedInstructionsCount)
{
	_CodeInfo ci = *_ci; /* A working copy, we don't touch user's _ci except OUT params. */
	_PrefixState ps;
	/* Bookkeep these from ci below, as it makes things way simpler. */
	const uint8_t* code;
	int codeLen;
	_OffsetType codeOffset;

	_DecodeResult ret = DECRES_SUCCESS;

	/* Current working decoded instruction in results. */
	_DInst* pdi = (_DInst*)&result[0]; /* There's always a room for at least one slot, checked earlier. */
	_DInst* maxResultAddr;

	unsigned int features = ci.features;

	unsigned int diStructSize;
	/* Use next entry. */
#ifndef DISTORM_LIGHT
	if (supportOldIntr) {
		diStructSize = sizeof(_DecodedInst);
		maxResultAddr = (_DInst*)((size_t)&result[0] + (maxResultCount * sizeof(_DecodedInst)));
	}
	else
#endif /* DISTORM_LIGHT */
	{
		diStructSize = sizeof(_DInst);
		maxResultAddr = &result[maxResultCount];
	}

	ci.addrMask = (_OffsetType)-1;

#ifdef DISTORM_LIGHT
	supportOldIntr; /* Unreferenced. */

	/*
	 * Only truncate address if we are using the decompose interface.
	 * Otherwise, we use the textual interface which needs full addresses for formatting bytes output.
	 * So distorm_format will truncate later.
	 */
	if (features & DF_MAXIMUM_ADDR32) ci.addrMask = 0xffffffff;
	else if (features & DF_MAXIMUM_ADDR16) ci.addrMask = 0xffff;
#endif

	ps.count = 1; /* Force zero'ing ps below. */

	/* Decode instructions as long as we have what to decode/enough room in entries. */
	while (ci.codeLen > 0) {
		code = ci.code;
		codeLen = ci.codeLen;
		codeOffset = ci.codeOffset;

		if (ps.count) memset(&ps, 0, sizeof(ps));

		/**** INSTRUCTION DECODING NEXT: ****/

		/* Make sure we didn't run out of output entries. */
		if (pdi >= maxResultAddr) {
			ret = DECRES_MEMORYERR;
			break;
		}

		ret = decode_inst(&ci, &ps, code, pdi);
		/* decode_inst keeps track (only if successful!) for code and codeLen but ignores codeOffset, fix it here. */
		ci.codeOffset += pdi->size;

		if (ret == DECRES_SUCCESS) {

			if (features & (DF_SINGLE_BYTE_STEP | DF_RETURN_FC_ONLY | DF_STOP_ON_PRIVILEGED | DF_STOP_ON_FLOW_CONTROL)) {

				/* Sync codeinfo, remember that currently it points to beginning of the instruction and prefixes if any. */
				if (features & DF_SINGLE_BYTE_STEP) {
					ci.code = code + 1;
					ci.codeLen = codeLen - 1;
					ci.codeOffset = codeOffset + 1;
				}

				/* See if we need to filter this instruction. */
				if ((features & DF_RETURN_FC_ONLY) && (META_GET_FC(pdi->meta) == FC_NONE)) {
					continue;
				}

				/* Check whether we need to stop on any feature. */
				if ((features & DF_STOP_ON_PRIVILEGED) && (FLAG_GET_PRIVILEGED(pdi->flags))) {
					pdi = (_DInst*)((char*)pdi + diStructSize);
					break; /* ret = DECRES_SUCCESS; */
				}

				if (features & DF_STOP_ON_FLOW_CONTROL) {
					unsigned int mfc = META_GET_FC(pdi->meta);
					if (mfc && (((features & DF_STOP_ON_CALL) && (mfc == FC_CALL)) ||
						((features & DF_STOP_ON_RET) && (mfc == FC_RET)) ||
						((features & DF_STOP_ON_SYS) && (mfc == FC_SYS)) ||
						((features & DF_STOP_ON_UNC_BRANCH) && (mfc == FC_UNC_BRANCH)) ||
						((features & DF_STOP_ON_CND_BRANCH) && (mfc == FC_CND_BRANCH)) ||
						((features & DF_STOP_ON_INT) && (mfc == FC_INT)) ||
						((features & DF_STOP_ON_CMOV) && (mfc == FC_CMOV)) ||
						((features & DF_STOP_ON_HLT) && (mfc == FC_HLT)))) {
						pdi = (_DInst*)((char*)pdi + diStructSize);
						break; /* ret = DECRES_SUCCESS; */
					}
				}
			}

			/* Allocate at least one more entry to use, for the next instruction. */
			pdi = (_DInst*)((char*)pdi + diStructSize);
		}
		else { /* ret == DECRES_INPUTERR */

			/* Handle failure of decoding last instruction. */
			if ((!(features & DF_RETURN_FC_ONLY))) {
				memset(pdi, 0, sizeof(_DInst));
				pdi->flags = FLAG_NOT_DECODABLE;
				pdi->imm.byte = *code;
				pdi->size = 1;
				pdi->addr = codeOffset & ci.addrMask;
				pdi = (_DInst*)((char*)pdi + diStructSize);

				/* If an instruction wasn't decoded then stop on undecodeable if set. */
				if (features & DF_STOP_ON_UNDECODEABLE) {
					ret = DECRES_SUCCESS;
					break;
				}
			}

			/* Skip a single byte in case of a failure and retry instruction. */
			ci.code = code + 1;
			ci.codeLen = codeLen - 1;
			ci.codeOffset = codeOffset + 1;

			/* Reset return value. */
			ret = DECRES_SUCCESS;
		}
	}

	/* Set OUT params. */
	*usedInstructionsCount = (unsigned int)(((size_t)pdi - (size_t)result) / (size_t)diStructSize);
	_ci->nextOffset = ci.codeOffset;

	return ret;
}